

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_16x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  int8_t *piVar2;
  int iVar3;
  undefined7 in_register_00000009;
  int fliplr;
  long lVar4;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar7 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i in [64];
  __m128i out [64];
  undefined8 local_828;
  undefined4 uStack_820;
  undefined4 uStack_81c;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  undefined4 local_7c8;
  undefined4 uStack_7c4;
  undefined4 uStack_7c0;
  undefined4 uStack_7bc;
  undefined4 local_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 local_7a8;
  undefined4 uStack_7a4;
  undefined4 uStack_7a0;
  undefined4 uStack_79c;
  undefined4 local_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 local_788;
  undefined4 uStack_784;
  undefined4 uStack_780;
  undefined4 uStack_77c;
  undefined4 local_778;
  undefined4 uStack_774;
  undefined4 uStack_770;
  undefined4 uStack_76c;
  undefined4 uStack_760;
  undefined4 uStack_75c;
  undefined4 local_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 local_748;
  undefined4 uStack_744;
  undefined4 uStack_740;
  undefined4 uStack_73c;
  undefined4 local_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined4 uStack_6e0;
  undefined4 uStack_6dc;
  undefined4 local_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 local_6c8;
  undefined4 uStack_6c4;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 local_6a8;
  undefined4 uStack_6a4;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  undefined4 local_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 local_688;
  undefined4 uStack_684;
  undefined4 uStack_680;
  undefined4 uStack_67c;
  undefined4 local_678;
  undefined4 uStack_674;
  undefined4 uStack_670;
  undefined4 uStack_66c;
  undefined4 uStack_660;
  undefined4 uStack_65c;
  undefined4 local_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined4 local_648;
  undefined4 uStack_644;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  undefined4 local_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 uStack_5e0;
  undefined4 uStack_5dc;
  undefined4 local_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 local_5c8;
  undefined4 uStack_5c4;
  undefined4 uStack_5c0;
  undefined4 uStack_5bc;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 local_5a8;
  undefined4 uStack_5a4;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  undefined4 local_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 local_588;
  undefined4 uStack_584;
  undefined4 uStack_580;
  undefined4 uStack_57c;
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  undefined4 local_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 local_548;
  undefined4 uStack_544;
  undefined4 uStack_540;
  undefined4 uStack_53c;
  undefined4 local_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 local_4c8;
  undefined4 uStack_4c4;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 local_448;
  undefined4 uStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined1 local_438 [16];
  undefined8 local_428;
  int aiStack_420 [254];
  
  piVar2 = av1_fwd_txfm_shift_ls[2];
  if (0xf < (uint)CONCAT71(in_register_00000009,tx_type)) {
    return;
  }
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    load_buffer_16x16(input,(__m128i *)&local_828,stride,0,0,(int)*av1_fwd_txfm_shift_ls[2]);
    fdct16x16_sse4_1((__m128i *)&local_828,(__m128i *)&local_428,0xd,4);
    goto LAB_00419069;
  case 1:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 0;
    goto LAB_0041903e;
  case 2:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 0;
    goto LAB_004196eb;
  case 3:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 0;
    goto LAB_0041a48e;
  case 4:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 1;
LAB_0041903e:
    load_buffer_16x16(input,(__m128i *)&local_828,stride,iVar3,0,(int)cVar1);
    fadst16x16_sse4_1((__m128i *)&local_828,(__m128i *)&local_428,0xd,4);
LAB_00419069:
    col_txfm_16x16_rounding((__m128i *)&local_428,-(int)piVar2[1]);
    local_828._0_4_ = (undefined4)local_428;
    local_828._4_4_ = aiStack_420[0xe];
    uStack_820 = aiStack_420[0x1e];
    uStack_81c = aiStack_420[0x2e];
    uStack_7a0 = aiStack_420[0x20];
    uStack_79c = aiStack_420[0x30];
    uStack_760 = aiStack_420[1];
    uStack_75c = aiStack_420[0x11];
    local_758 = aiStack_420[0x21];
    uStack_754 = aiStack_420[0x31];
    uStack_6e0 = aiStack_420[3];
    uStack_6dc = aiStack_420[0x13];
    local_6d8 = aiStack_420[0x23];
    uStack_6d4 = aiStack_420[0x33];
    uStack_6a0 = aiStack_420[0x24];
    uStack_69c = aiStack_420[0x34];
    uStack_660 = aiStack_420[5];
    uStack_65c = aiStack_420[0x15];
    local_658 = aiStack_420[0x25];
    uStack_654 = aiStack_420[0x35];
    uStack_7d0 = aiStack_420[0x3f];
    uStack_7cc = aiStack_420[0x4f];
    local_7c8 = aiStack_420[0x5f];
    uStack_7c4 = aiStack_420[0x6f];
    local_798 = aiStack_420[0x40];
    uStack_794 = aiStack_420[0x50];
    uStack_790 = aiStack_420[0x60];
    uStack_78c = aiStack_420[0x70];
    uStack_750 = aiStack_420[0x41];
    uStack_74c = aiStack_420[0x51];
    local_748 = aiStack_420[0x61];
    uStack_744 = aiStack_420[0x71];
    uStack_6d0 = aiStack_420[0x43];
    uStack_6cc = aiStack_420[0x53];
    local_6c8 = aiStack_420[99];
    uStack_6c4 = aiStack_420[0x73];
    local_698 = aiStack_420[0x44];
    uStack_694 = aiStack_420[0x54];
    uStack_690 = aiStack_420[100];
    uStack_68c = aiStack_420[0x74];
    uStack_650 = aiStack_420[0x45];
    uStack_64c = aiStack_420[0x55];
    local_648 = aiStack_420[0x65];
    uStack_644 = aiStack_420[0x75];
    uStack_5e0 = aiStack_420[7];
    uStack_5dc = aiStack_420[0x17];
    local_5d8 = aiStack_420[0x27];
    uStack_5d4 = aiStack_420[0x37];
    uStack_5a0 = aiStack_420[0x28];
    uStack_59c = aiStack_420[0x38];
    uStack_560 = aiStack_420[9];
    uStack_55c = aiStack_420[0x19];
    local_558 = aiStack_420[0x29];
    uStack_554 = aiStack_420[0x39];
    uStack_4e0 = aiStack_420[0xb];
    uStack_4dc = aiStack_420[0x1b];
    local_4d8 = aiStack_420[0x2b];
    uStack_4d4 = aiStack_420[0x3b];
    uStack_4a0 = aiStack_420[0x2c];
    uStack_49c = aiStack_420[0x3c];
    uStack_460 = aiStack_420[0xd];
    uStack_45c = aiStack_420[0x1d];
    local_458 = aiStack_420[0x2d];
    uStack_454 = aiStack_420[0x3d];
    uStack_5d0 = aiStack_420[0x47];
    uStack_5cc = aiStack_420[0x57];
    local_5c8 = aiStack_420[0x67];
    uStack_5c4 = aiStack_420[0x77];
    local_598 = aiStack_420[0x48];
    uStack_594 = aiStack_420[0x58];
    uStack_590 = aiStack_420[0x68];
    uStack_58c = aiStack_420[0x78];
    uStack_550 = aiStack_420[0x49];
    uStack_54c = aiStack_420[0x59];
    local_548 = aiStack_420[0x69];
    uStack_544 = aiStack_420[0x79];
    uStack_4d0 = aiStack_420[0x4b];
    uStack_4cc = aiStack_420[0x5b];
    local_4c8 = aiStack_420[0x6b];
    uStack_4c4 = aiStack_420[0x7b];
    local_498 = aiStack_420[0x4c];
    uStack_494 = aiStack_420[0x5c];
    uStack_490 = aiStack_420[0x6c];
    uStack_48c = aiStack_420[0x7c];
    uStack_450 = aiStack_420[0x4d];
    uStack_44c = aiStack_420[0x5d];
    local_448 = aiStack_420[0x6d];
    uStack_444 = aiStack_420[0x7d];
    uStack_7c0 = aiStack_420[0x7f];
    uStack_7bc = aiStack_420[0x8f];
    local_7b8 = aiStack_420[0x9f];
    uStack_7b4 = aiStack_420[0xaf];
    local_788 = aiStack_420[0x80];
    uStack_784 = aiStack_420[0x90];
    uStack_780 = aiStack_420[0xa0];
    uStack_77c = aiStack_420[0xb0];
    uStack_740 = aiStack_420[0x81];
    uStack_73c = aiStack_420[0x91];
    local_738 = aiStack_420[0xa1];
    uStack_734 = aiStack_420[0xb1];
    uStack_6c0 = aiStack_420[0x83];
    uStack_6bc = aiStack_420[0x93];
    local_6b8 = aiStack_420[0xa3];
    uStack_6b4 = aiStack_420[0xb3];
    local_688 = aiStack_420[0x84];
    uStack_684 = aiStack_420[0x94];
    uStack_680 = aiStack_420[0xa4];
    uStack_67c = aiStack_420[0xb4];
    uStack_640 = aiStack_420[0x85];
    uStack_63c = aiStack_420[0x95];
    local_638 = aiStack_420[0xa5];
    uStack_634 = aiStack_420[0xb5];
    uStack_7b0 = aiStack_420[0xbf];
    uStack_7ac = aiStack_420[0xcf];
    local_7a8 = aiStack_420[0xdf];
    uStack_7a4 = aiStack_420[0xef];
    local_778 = aiStack_420[0xc0];
    uStack_774 = aiStack_420[0xd0];
    uStack_770 = aiStack_420[0xe0];
    uStack_76c = aiStack_420[0xf0];
    uStack_730 = aiStack_420[0xc1];
    uStack_72c = aiStack_420[0xd1];
    uStack_6b0 = aiStack_420[0xc3];
    uStack_6ac = aiStack_420[0xd3];
    local_6a8 = aiStack_420[0xe3];
    uStack_6a4 = aiStack_420[0xf3];
    local_678 = aiStack_420[0xc4];
    uStack_674 = aiStack_420[0xd4];
    uStack_670 = aiStack_420[0xe4];
    uStack_66c = aiStack_420[0xf4];
    uStack_630 = aiStack_420[0xc5];
    uStack_62c = aiStack_420[0xd5];
    uStack_5c0 = aiStack_420[0x87];
    uStack_5bc = aiStack_420[0x97];
    local_5b8 = aiStack_420[0xa7];
    uStack_5b4 = aiStack_420[0xb7];
    local_588 = aiStack_420[0x88];
    uStack_584 = aiStack_420[0x98];
    uStack_580 = aiStack_420[0xa8];
    uStack_57c = aiStack_420[0xb8];
    uStack_540 = aiStack_420[0x89];
    uStack_53c = aiStack_420[0x99];
    local_538 = aiStack_420[0xa9];
    uStack_534 = aiStack_420[0xb9];
    uStack_4c0 = aiStack_420[0x8b];
    uStack_4bc = aiStack_420[0x9b];
    local_4b8 = aiStack_420[0xab];
    uStack_4b4 = aiStack_420[0xbb];
    local_488 = aiStack_420[0x8c];
    uStack_484 = aiStack_420[0x9c];
    uStack_480 = aiStack_420[0xac];
    uStack_47c = aiStack_420[0xbc];
    uStack_440 = aiStack_420[0x8d];
    uStack_43c = aiStack_420[0x9d];
    local_438._4_4_ = aiStack_420[0xbd];
    local_438._0_4_ = aiStack_420[0xad];
    uStack_5b0 = aiStack_420[199];
    uStack_5ac = aiStack_420[0xd7];
    local_5a8 = aiStack_420[0xe7];
    uStack_5a4 = aiStack_420[0xf7];
    local_578 = aiStack_420[200];
    uStack_574 = aiStack_420[0xd8];
    uStack_570 = aiStack_420[0xe8];
    uStack_56c = aiStack_420[0xf8];
    uStack_530 = aiStack_420[0xc9];
    uStack_52c = aiStack_420[0xd9];
    uStack_4b0 = aiStack_420[0xcb];
    uStack_4ac = aiStack_420[0xdb];
    local_4a8 = aiStack_420[0xeb];
    uStack_4a4 = aiStack_420[0xfb];
    local_438._8_4_ = aiStack_420[0xcd];
    local_438._12_4_ = aiStack_420[0xdd];
    local_428._0_4_ = aiStack_420[0xed];
    local_428._4_4_ = aiStack_420[0xfd];
LAB_004196c9:
    fdct16x16_sse4_1((__m128i *)&local_828,(__m128i *)&local_428,0xc,4);
    break;
  case 5:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 1;
LAB_004196eb:
    load_buffer_16x16(input,(__m128i *)&local_828,stride,0,iVar3,(int)cVar1);
    fdct16x16_sse4_1((__m128i *)&local_828,(__m128i *)&local_428,0xd,4);
LAB_0041a4b9:
    col_txfm_16x16_rounding((__m128i *)&local_428,-(int)piVar2[1]);
    local_828._0_4_ = (undefined4)local_428;
    local_828._4_4_ = aiStack_420[0xe];
    uStack_820 = aiStack_420[0x1e];
    uStack_81c = aiStack_420[0x2e];
    uStack_7a0 = aiStack_420[0x20];
    uStack_79c = aiStack_420[0x30];
    uStack_760 = aiStack_420[1];
    uStack_75c = aiStack_420[0x11];
    local_758 = aiStack_420[0x21];
    uStack_754 = aiStack_420[0x31];
    uStack_6e0 = aiStack_420[3];
    uStack_6dc = aiStack_420[0x13];
    local_6d8 = aiStack_420[0x23];
    uStack_6d4 = aiStack_420[0x33];
    uStack_6a0 = aiStack_420[0x24];
    uStack_69c = aiStack_420[0x34];
    uStack_660 = aiStack_420[5];
    uStack_65c = aiStack_420[0x15];
    local_658 = aiStack_420[0x25];
    uStack_654 = aiStack_420[0x35];
    uStack_7d0 = aiStack_420[0x3f];
    uStack_7cc = aiStack_420[0x4f];
    local_7c8 = aiStack_420[0x5f];
    uStack_7c4 = aiStack_420[0x6f];
    local_798 = aiStack_420[0x40];
    uStack_794 = aiStack_420[0x50];
    uStack_790 = aiStack_420[0x60];
    uStack_78c = aiStack_420[0x70];
    uStack_750 = aiStack_420[0x41];
    uStack_74c = aiStack_420[0x51];
    local_748 = aiStack_420[0x61];
    uStack_744 = aiStack_420[0x71];
    uStack_6d0 = aiStack_420[0x43];
    uStack_6cc = aiStack_420[0x53];
    local_6c8 = aiStack_420[99];
    uStack_6c4 = aiStack_420[0x73];
    local_698 = aiStack_420[0x44];
    uStack_694 = aiStack_420[0x54];
    uStack_690 = aiStack_420[100];
    uStack_68c = aiStack_420[0x74];
    uStack_650 = aiStack_420[0x45];
    uStack_64c = aiStack_420[0x55];
    local_648 = aiStack_420[0x65];
    uStack_644 = aiStack_420[0x75];
    uStack_5e0 = aiStack_420[7];
    uStack_5dc = aiStack_420[0x17];
    local_5d8 = aiStack_420[0x27];
    uStack_5d4 = aiStack_420[0x37];
    uStack_5a0 = aiStack_420[0x28];
    uStack_59c = aiStack_420[0x38];
    uStack_560 = aiStack_420[9];
    uStack_55c = aiStack_420[0x19];
    local_558 = aiStack_420[0x29];
    uStack_554 = aiStack_420[0x39];
    uStack_4e0 = aiStack_420[0xb];
    uStack_4dc = aiStack_420[0x1b];
    local_4d8 = aiStack_420[0x2b];
    uStack_4d4 = aiStack_420[0x3b];
    uStack_4a0 = aiStack_420[0x2c];
    uStack_49c = aiStack_420[0x3c];
    uStack_460 = aiStack_420[0xd];
    uStack_45c = aiStack_420[0x1d];
    local_458 = aiStack_420[0x2d];
    uStack_454 = aiStack_420[0x3d];
    uStack_5d0 = aiStack_420[0x47];
    uStack_5cc = aiStack_420[0x57];
    local_5c8 = aiStack_420[0x67];
    uStack_5c4 = aiStack_420[0x77];
    local_598 = aiStack_420[0x48];
    uStack_594 = aiStack_420[0x58];
    uStack_590 = aiStack_420[0x68];
    uStack_58c = aiStack_420[0x78];
    uStack_550 = aiStack_420[0x49];
    uStack_54c = aiStack_420[0x59];
    local_548 = aiStack_420[0x69];
    uStack_544 = aiStack_420[0x79];
    uStack_4d0 = aiStack_420[0x4b];
    uStack_4cc = aiStack_420[0x5b];
    local_4c8 = aiStack_420[0x6b];
    uStack_4c4 = aiStack_420[0x7b];
    local_498 = aiStack_420[0x4c];
    uStack_494 = aiStack_420[0x5c];
    uStack_490 = aiStack_420[0x6c];
    uStack_48c = aiStack_420[0x7c];
    uStack_450 = aiStack_420[0x4d];
    uStack_44c = aiStack_420[0x5d];
    local_448 = aiStack_420[0x6d];
    uStack_444 = aiStack_420[0x7d];
    uStack_7c0 = aiStack_420[0x7f];
    uStack_7bc = aiStack_420[0x8f];
    local_7b8 = aiStack_420[0x9f];
    uStack_7b4 = aiStack_420[0xaf];
    local_788 = aiStack_420[0x80];
    uStack_784 = aiStack_420[0x90];
    uStack_780 = aiStack_420[0xa0];
    uStack_77c = aiStack_420[0xb0];
    uStack_740 = aiStack_420[0x81];
    uStack_73c = aiStack_420[0x91];
    local_738 = aiStack_420[0xa1];
    uStack_734 = aiStack_420[0xb1];
    uStack_6c0 = aiStack_420[0x83];
    uStack_6bc = aiStack_420[0x93];
    local_6b8 = aiStack_420[0xa3];
    uStack_6b4 = aiStack_420[0xb3];
    local_688 = aiStack_420[0x84];
    uStack_684 = aiStack_420[0x94];
    uStack_680 = aiStack_420[0xa4];
    uStack_67c = aiStack_420[0xb4];
    uStack_640 = aiStack_420[0x85];
    uStack_63c = aiStack_420[0x95];
    local_638 = aiStack_420[0xa5];
    uStack_634 = aiStack_420[0xb5];
    uStack_7b0 = aiStack_420[0xbf];
    uStack_7ac = aiStack_420[0xcf];
    local_7a8 = aiStack_420[0xdf];
    uStack_7a4 = aiStack_420[0xef];
    local_778 = aiStack_420[0xc0];
    uStack_774 = aiStack_420[0xd0];
    uStack_770 = aiStack_420[0xe0];
    uStack_76c = aiStack_420[0xf0];
    uStack_730 = aiStack_420[0xc1];
    uStack_72c = aiStack_420[0xd1];
    uStack_6b0 = aiStack_420[0xc3];
    uStack_6ac = aiStack_420[0xd3];
    local_6a8 = aiStack_420[0xe3];
    uStack_6a4 = aiStack_420[0xf3];
    local_678 = aiStack_420[0xc4];
    uStack_674 = aiStack_420[0xd4];
    uStack_670 = aiStack_420[0xe4];
    uStack_66c = aiStack_420[0xf4];
    uStack_630 = aiStack_420[0xc5];
    uStack_62c = aiStack_420[0xd5];
    uStack_5c0 = aiStack_420[0x87];
    uStack_5bc = aiStack_420[0x97];
    local_5b8 = aiStack_420[0xa7];
    uStack_5b4 = aiStack_420[0xb7];
    local_588 = aiStack_420[0x88];
    uStack_584 = aiStack_420[0x98];
    uStack_580 = aiStack_420[0xa8];
    uStack_57c = aiStack_420[0xb8];
    uStack_540 = aiStack_420[0x89];
    uStack_53c = aiStack_420[0x99];
    local_538 = aiStack_420[0xa9];
    uStack_534 = aiStack_420[0xb9];
    uStack_4c0 = aiStack_420[0x8b];
    uStack_4bc = aiStack_420[0x9b];
    local_4b8 = aiStack_420[0xab];
    uStack_4b4 = aiStack_420[0xbb];
    local_488 = aiStack_420[0x8c];
    uStack_484 = aiStack_420[0x9c];
    uStack_480 = aiStack_420[0xac];
    uStack_47c = aiStack_420[0xbc];
    uStack_440 = aiStack_420[0x8d];
    uStack_43c = aiStack_420[0x9d];
    local_438._4_4_ = aiStack_420[0xbd];
    local_438._0_4_ = aiStack_420[0xad];
    uStack_5b0 = aiStack_420[199];
    uStack_5ac = aiStack_420[0xd7];
    local_5a8 = aiStack_420[0xe7];
    uStack_5a4 = aiStack_420[0xf7];
    local_578 = aiStack_420[200];
    uStack_574 = aiStack_420[0xd8];
    uStack_570 = aiStack_420[0xe8];
    uStack_56c = aiStack_420[0xf8];
    uStack_530 = aiStack_420[0xc9];
    uStack_52c = aiStack_420[0xd9];
    uStack_4b0 = aiStack_420[0xcb];
    uStack_4ac = aiStack_420[0xdb];
    local_4a8 = aiStack_420[0xeb];
    uStack_4a4 = aiStack_420[0xfb];
    local_438._8_4_ = aiStack_420[0xcd];
    local_438._12_4_ = aiStack_420[0xdd];
    local_428._0_4_ = aiStack_420[0xed];
    local_428._4_4_ = aiStack_420[0xfd];
LAB_0041ab19:
    fadst16x16_sse4_1((__m128i *)&local_828,(__m128i *)&local_428,0xc,4);
    break;
  case 6:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 1;
    goto LAB_00419da7;
  case 7:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 0;
LAB_00419da7:
    fliplr = 1;
    goto LAB_0041a491;
  case 8:
    cVar1 = *av1_fwd_txfm_shift_ls[2];
    iVar3 = 1;
LAB_0041a48e:
    fliplr = 0;
LAB_0041a491:
    load_buffer_16x16(input,(__m128i *)&local_828,stride,iVar3,fliplr,(int)cVar1);
    fadst16x16_sse4_1((__m128i *)&local_828,(__m128i *)&local_428,0xd,4);
    goto LAB_0041a4b9;
  case 9:
    lVar4 = 0;
    load_buffer_16x16(input,(__m128i *)&local_828,stride,0,0,(int)*av1_fwd_txfm_shift_ls[2]);
    do {
      auVar7 = pmulld(*(undefined1 (*) [16])((long)&local_828 + lVar4),_DAT_005634b0);
      *(int *)((long)&local_428 + lVar4) = auVar7._0_4_ + 0x800 >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + -4) = auVar7._4_4_ + 0x800 >> 0xc;
      *(int *)((long)aiStack_420 + lVar4) = auVar7._8_4_ + 0x800 >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + 4) = auVar7._12_4_ + 0x800 >> 0xc;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x400);
    col_txfm_16x16_rounding((__m128i *)&local_428,-(int)piVar2[1]);
    local_828._0_4_ = (undefined4)local_428;
    local_828._4_4_ = aiStack_420[0xe];
    uStack_820 = aiStack_420[0x1e];
    uStack_81c = aiStack_420[0x2e];
    uStack_7a0 = aiStack_420[0x20];
    uStack_79c = aiStack_420[0x30];
    uStack_760 = aiStack_420[1];
    uStack_75c = aiStack_420[0x11];
    local_758 = aiStack_420[0x21];
    uStack_754 = aiStack_420[0x31];
    uStack_6e0 = aiStack_420[3];
    uStack_6dc = aiStack_420[0x13];
    local_6d8 = aiStack_420[0x23];
    uStack_6d4 = aiStack_420[0x33];
    uStack_6a0 = aiStack_420[0x24];
    uStack_69c = aiStack_420[0x34];
    uStack_660 = aiStack_420[5];
    uStack_65c = aiStack_420[0x15];
    local_658 = aiStack_420[0x25];
    uStack_654 = aiStack_420[0x35];
    uStack_7d0 = aiStack_420[0x3f];
    uStack_7cc = aiStack_420[0x4f];
    local_7c8 = aiStack_420[0x5f];
    uStack_7c4 = aiStack_420[0x6f];
    local_798 = aiStack_420[0x40];
    uStack_794 = aiStack_420[0x50];
    uStack_790 = aiStack_420[0x60];
    uStack_78c = aiStack_420[0x70];
    uStack_750 = aiStack_420[0x41];
    uStack_74c = aiStack_420[0x51];
    local_748 = aiStack_420[0x61];
    uStack_744 = aiStack_420[0x71];
    uStack_6d0 = aiStack_420[0x43];
    uStack_6cc = aiStack_420[0x53];
    local_6c8 = aiStack_420[99];
    uStack_6c4 = aiStack_420[0x73];
    local_698 = aiStack_420[0x44];
    uStack_694 = aiStack_420[0x54];
    uStack_690 = aiStack_420[100];
    uStack_68c = aiStack_420[0x74];
    uStack_650 = aiStack_420[0x45];
    uStack_64c = aiStack_420[0x55];
    local_648 = aiStack_420[0x65];
    uStack_644 = aiStack_420[0x75];
    uStack_5e0 = aiStack_420[7];
    uStack_5dc = aiStack_420[0x17];
    local_5d8 = aiStack_420[0x27];
    uStack_5d4 = aiStack_420[0x37];
    uStack_5a0 = aiStack_420[0x28];
    uStack_59c = aiStack_420[0x38];
    uStack_560 = aiStack_420[9];
    uStack_55c = aiStack_420[0x19];
    local_558 = aiStack_420[0x29];
    uStack_554 = aiStack_420[0x39];
    uStack_4e0 = aiStack_420[0xb];
    uStack_4dc = aiStack_420[0x1b];
    local_4d8 = aiStack_420[0x2b];
    uStack_4d4 = aiStack_420[0x3b];
    uStack_4a0 = aiStack_420[0x2c];
    uStack_49c = aiStack_420[0x3c];
    uStack_460 = aiStack_420[0xd];
    uStack_45c = aiStack_420[0x1d];
    local_458 = aiStack_420[0x2d];
    uStack_454 = aiStack_420[0x3d];
    uStack_5d0 = aiStack_420[0x47];
    uStack_5cc = aiStack_420[0x57];
    local_5c8 = aiStack_420[0x67];
    uStack_5c4 = aiStack_420[0x77];
    local_598 = aiStack_420[0x48];
    uStack_594 = aiStack_420[0x58];
    uStack_590 = aiStack_420[0x68];
    uStack_58c = aiStack_420[0x78];
    uStack_550 = aiStack_420[0x49];
    uStack_54c = aiStack_420[0x59];
    local_548 = aiStack_420[0x69];
    uStack_544 = aiStack_420[0x79];
    uStack_4d0 = aiStack_420[0x4b];
    uStack_4cc = aiStack_420[0x5b];
    local_4c8 = aiStack_420[0x6b];
    uStack_4c4 = aiStack_420[0x7b];
    local_498 = aiStack_420[0x4c];
    uStack_494 = aiStack_420[0x5c];
    uStack_490 = aiStack_420[0x6c];
    uStack_48c = aiStack_420[0x7c];
    uStack_450 = aiStack_420[0x4d];
    uStack_44c = aiStack_420[0x5d];
    local_448 = aiStack_420[0x6d];
    uStack_444 = aiStack_420[0x7d];
    uStack_7c0 = aiStack_420[0x7f];
    uStack_7bc = aiStack_420[0x8f];
    local_7b8 = aiStack_420[0x9f];
    uStack_7b4 = aiStack_420[0xaf];
    local_788 = aiStack_420[0x80];
    uStack_784 = aiStack_420[0x90];
    uStack_780 = aiStack_420[0xa0];
    uStack_77c = aiStack_420[0xb0];
    uStack_740 = aiStack_420[0x81];
    uStack_73c = aiStack_420[0x91];
    local_738 = aiStack_420[0xa1];
    uStack_734 = aiStack_420[0xb1];
    uStack_6c0 = aiStack_420[0x83];
    uStack_6bc = aiStack_420[0x93];
    local_6b8 = aiStack_420[0xa3];
    uStack_6b4 = aiStack_420[0xb3];
    local_688 = aiStack_420[0x84];
    uStack_684 = aiStack_420[0x94];
    uStack_680 = aiStack_420[0xa4];
    uStack_67c = aiStack_420[0xb4];
    uStack_640 = aiStack_420[0x85];
    uStack_63c = aiStack_420[0x95];
    local_638 = aiStack_420[0xa5];
    uStack_634 = aiStack_420[0xb5];
    uStack_7b0 = aiStack_420[0xbf];
    uStack_7ac = aiStack_420[0xcf];
    local_7a8 = aiStack_420[0xdf];
    uStack_7a4 = aiStack_420[0xef];
    local_778 = aiStack_420[0xc0];
    uStack_774 = aiStack_420[0xd0];
    uStack_770 = aiStack_420[0xe0];
    uStack_76c = aiStack_420[0xf0];
    uStack_730 = aiStack_420[0xc1];
    uStack_72c = aiStack_420[0xd1];
    uStack_6b0 = aiStack_420[0xc3];
    uStack_6ac = aiStack_420[0xd3];
    local_6a8 = aiStack_420[0xe3];
    uStack_6a4 = aiStack_420[0xf3];
    local_678 = aiStack_420[0xc4];
    uStack_674 = aiStack_420[0xd4];
    uStack_670 = aiStack_420[0xe4];
    uStack_66c = aiStack_420[0xf4];
    uStack_630 = aiStack_420[0xc5];
    uStack_62c = aiStack_420[0xd5];
    uStack_5c0 = aiStack_420[0x87];
    uStack_5bc = aiStack_420[0x97];
    local_5b8 = aiStack_420[0xa7];
    uStack_5b4 = aiStack_420[0xb7];
    local_588 = aiStack_420[0x88];
    uStack_584 = aiStack_420[0x98];
    uStack_580 = aiStack_420[0xa8];
    uStack_57c = aiStack_420[0xb8];
    uStack_540 = aiStack_420[0x89];
    uStack_53c = aiStack_420[0x99];
    local_538 = aiStack_420[0xa9];
    uStack_534 = aiStack_420[0xb9];
    uStack_4c0 = aiStack_420[0x8b];
    uStack_4bc = aiStack_420[0x9b];
    local_4b8 = aiStack_420[0xab];
    uStack_4b4 = aiStack_420[0xbb];
    local_488 = aiStack_420[0x8c];
    uStack_484 = aiStack_420[0x9c];
    uStack_480 = aiStack_420[0xac];
    uStack_47c = aiStack_420[0xbc];
    uStack_440 = aiStack_420[0x8d];
    uStack_43c = aiStack_420[0x9d];
    uStack_5b0 = aiStack_420[199];
    uStack_5ac = aiStack_420[0xd7];
    local_5a8 = aiStack_420[0xe7];
    uStack_5a4 = aiStack_420[0xf7];
    local_578 = aiStack_420[200];
    uStack_574 = aiStack_420[0xd8];
    uStack_570 = aiStack_420[0xe8];
    uStack_56c = aiStack_420[0xf8];
    uStack_530 = aiStack_420[0xc9];
    uStack_52c = aiStack_420[0xd9];
    auVar6._0_8_ = CONCAT44(aiStack_420[0xdc],aiStack_420[0xcc]);
    auVar6._8_4_ = aiStack_420[0xcd];
    auVar6._12_4_ = aiStack_420[0xdd];
    auVar14._0_8_ = CONCAT44(aiStack_420[0xfc],aiStack_420[0xec]);
    auVar14._8_4_ = aiStack_420[0xed];
    auVar14._12_4_ = aiStack_420[0xfd];
    uStack_4b0 = aiStack_420[0xcb];
    uStack_4ac = aiStack_420[0xdb];
    local_4a8 = aiStack_420[0xeb];
    uStack_4a4 = aiStack_420[0xfb];
    auVar10._8_8_ = auVar14._0_8_;
    auVar10._0_8_ = auVar6._0_8_;
    auVar7 = pmovsxwd(auVar10,0x2d422d422d422d42);
    auVar11 = pmovsxwd(auVar14,0x800080008000800);
    local_438._8_8_ = auVar14._8_8_;
    local_438._0_8_ = auVar6._8_8_;
    lVar4 = 0;
    do {
      auVar15 = pmulld(*(undefined1 (*) [16])((long)&local_828 + lVar4),auVar7);
      *(int *)((long)&local_428 + lVar4) = auVar15._0_4_ + auVar11._0_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + -4) = auVar15._4_4_ + auVar11._4_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4) = auVar15._8_4_ + auVar11._8_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + 4) = auVar15._12_4_ + auVar11._12_4_ >> 0xc;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x400);
    break;
  case 10:
    lVar4 = 0;
    load_buffer_16x16(input,(__m128i *)&local_828,stride,0,0,(int)*av1_fwd_txfm_shift_ls[2]);
    fdct16x16_sse4_1((__m128i *)&local_828,(__m128i *)&local_428,0xd,4);
    col_txfm_16x16_rounding((__m128i *)&local_428,-(int)piVar2[1]);
    local_828._0_4_ = (undefined4)local_428;
    local_828._4_4_ = aiStack_420[0xe];
    uStack_820 = aiStack_420[0x1e];
    uStack_81c = aiStack_420[0x2e];
    uStack_7a0 = aiStack_420[0x20];
    uStack_79c = aiStack_420[0x30];
    uStack_760 = aiStack_420[1];
    uStack_75c = aiStack_420[0x11];
    local_758 = aiStack_420[0x21];
    uStack_754 = aiStack_420[0x31];
    uStack_6e0 = aiStack_420[3];
    uStack_6dc = aiStack_420[0x13];
    local_6d8 = aiStack_420[0x23];
    uStack_6d4 = aiStack_420[0x33];
    uStack_6a0 = aiStack_420[0x24];
    uStack_69c = aiStack_420[0x34];
    uStack_660 = aiStack_420[5];
    uStack_65c = aiStack_420[0x15];
    local_658 = aiStack_420[0x25];
    uStack_654 = aiStack_420[0x35];
    uStack_7d0 = aiStack_420[0x3f];
    uStack_7cc = aiStack_420[0x4f];
    local_7c8 = aiStack_420[0x5f];
    uStack_7c4 = aiStack_420[0x6f];
    local_798 = aiStack_420[0x40];
    uStack_794 = aiStack_420[0x50];
    uStack_790 = aiStack_420[0x60];
    uStack_78c = aiStack_420[0x70];
    uStack_750 = aiStack_420[0x41];
    uStack_74c = aiStack_420[0x51];
    local_748 = aiStack_420[0x61];
    uStack_744 = aiStack_420[0x71];
    uStack_6d0 = aiStack_420[0x43];
    uStack_6cc = aiStack_420[0x53];
    local_6c8 = aiStack_420[99];
    uStack_6c4 = aiStack_420[0x73];
    local_698 = aiStack_420[0x44];
    uStack_694 = aiStack_420[0x54];
    uStack_690 = aiStack_420[100];
    uStack_68c = aiStack_420[0x74];
    uStack_650 = aiStack_420[0x45];
    uStack_64c = aiStack_420[0x55];
    local_648 = aiStack_420[0x65];
    uStack_644 = aiStack_420[0x75];
    uStack_5e0 = aiStack_420[7];
    uStack_5dc = aiStack_420[0x17];
    local_5d8 = aiStack_420[0x27];
    uStack_5d4 = aiStack_420[0x37];
    uStack_5a0 = aiStack_420[0x28];
    uStack_59c = aiStack_420[0x38];
    uStack_560 = aiStack_420[9];
    uStack_55c = aiStack_420[0x19];
    local_558 = aiStack_420[0x29];
    uStack_554 = aiStack_420[0x39];
    uStack_4e0 = aiStack_420[0xb];
    uStack_4dc = aiStack_420[0x1b];
    local_4d8 = aiStack_420[0x2b];
    uStack_4d4 = aiStack_420[0x3b];
    uStack_4a0 = aiStack_420[0x2c];
    uStack_49c = aiStack_420[0x3c];
    uStack_460 = aiStack_420[0xd];
    uStack_45c = aiStack_420[0x1d];
    local_458 = aiStack_420[0x2d];
    uStack_454 = aiStack_420[0x3d];
    uStack_5d0 = aiStack_420[0x47];
    uStack_5cc = aiStack_420[0x57];
    local_5c8 = aiStack_420[0x67];
    uStack_5c4 = aiStack_420[0x77];
    local_598 = aiStack_420[0x48];
    uStack_594 = aiStack_420[0x58];
    uStack_590 = aiStack_420[0x68];
    uStack_58c = aiStack_420[0x78];
    uStack_550 = aiStack_420[0x49];
    uStack_54c = aiStack_420[0x59];
    local_548 = aiStack_420[0x69];
    uStack_544 = aiStack_420[0x79];
    uStack_4d0 = aiStack_420[0x4b];
    uStack_4cc = aiStack_420[0x5b];
    local_4c8 = aiStack_420[0x6b];
    uStack_4c4 = aiStack_420[0x7b];
    local_498 = aiStack_420[0x4c];
    uStack_494 = aiStack_420[0x5c];
    uStack_490 = aiStack_420[0x6c];
    uStack_48c = aiStack_420[0x7c];
    uStack_450 = aiStack_420[0x4d];
    uStack_44c = aiStack_420[0x5d];
    local_448 = aiStack_420[0x6d];
    uStack_444 = aiStack_420[0x7d];
    uStack_7c0 = aiStack_420[0x7f];
    uStack_7bc = aiStack_420[0x8f];
    local_7b8 = aiStack_420[0x9f];
    uStack_7b4 = aiStack_420[0xaf];
    local_788 = aiStack_420[0x80];
    uStack_784 = aiStack_420[0x90];
    uStack_780 = aiStack_420[0xa0];
    uStack_77c = aiStack_420[0xb0];
    uStack_740 = aiStack_420[0x81];
    uStack_73c = aiStack_420[0x91];
    local_738 = aiStack_420[0xa1];
    uStack_734 = aiStack_420[0xb1];
    uStack_6c0 = aiStack_420[0x83];
    uStack_6bc = aiStack_420[0x93];
    local_6b8 = aiStack_420[0xa3];
    uStack_6b4 = aiStack_420[0xb3];
    local_688 = aiStack_420[0x84];
    uStack_684 = aiStack_420[0x94];
    uStack_680 = aiStack_420[0xa4];
    uStack_67c = aiStack_420[0xb4];
    uStack_640 = aiStack_420[0x85];
    uStack_63c = aiStack_420[0x95];
    local_638 = aiStack_420[0xa5];
    uStack_634 = aiStack_420[0xb5];
    uStack_7b0 = aiStack_420[0xbf];
    uStack_7ac = aiStack_420[0xcf];
    local_7a8 = aiStack_420[0xdf];
    uStack_7a4 = aiStack_420[0xef];
    local_778 = aiStack_420[0xc0];
    uStack_774 = aiStack_420[0xd0];
    uStack_770 = aiStack_420[0xe0];
    uStack_76c = aiStack_420[0xf0];
    uStack_730 = aiStack_420[0xc1];
    uStack_72c = aiStack_420[0xd1];
    uStack_6b0 = aiStack_420[0xc3];
    uStack_6ac = aiStack_420[0xd3];
    local_6a8 = aiStack_420[0xe3];
    uStack_6a4 = aiStack_420[0xf3];
    local_678 = aiStack_420[0xc4];
    uStack_674 = aiStack_420[0xd4];
    uStack_670 = aiStack_420[0xe4];
    uStack_66c = aiStack_420[0xf4];
    uStack_630 = aiStack_420[0xc5];
    uStack_62c = aiStack_420[0xd5];
    uStack_5c0 = aiStack_420[0x87];
    uStack_5bc = aiStack_420[0x97];
    local_5b8 = aiStack_420[0xa7];
    uStack_5b4 = aiStack_420[0xb7];
    local_588 = aiStack_420[0x88];
    uStack_584 = aiStack_420[0x98];
    uStack_580 = aiStack_420[0xa8];
    uStack_57c = aiStack_420[0xb8];
    uStack_540 = aiStack_420[0x89];
    uStack_53c = aiStack_420[0x99];
    local_538 = aiStack_420[0xa9];
    uStack_534 = aiStack_420[0xb9];
    uStack_4c0 = aiStack_420[0x8b];
    uStack_4bc = aiStack_420[0x9b];
    local_4b8 = aiStack_420[0xab];
    uStack_4b4 = aiStack_420[0xbb];
    local_488 = aiStack_420[0x8c];
    uStack_484 = aiStack_420[0x9c];
    uStack_480 = aiStack_420[0xac];
    uStack_47c = aiStack_420[0xbc];
    uStack_440 = aiStack_420[0x8d];
    uStack_43c = aiStack_420[0x9d];
    uStack_5b0 = aiStack_420[199];
    uStack_5ac = aiStack_420[0xd7];
    local_5a8 = aiStack_420[0xe7];
    uStack_5a4 = aiStack_420[0xf7];
    local_578 = aiStack_420[200];
    uStack_574 = aiStack_420[0xd8];
    uStack_570 = aiStack_420[0xe8];
    uStack_56c = aiStack_420[0xf8];
    uStack_530 = aiStack_420[0xc9];
    uStack_52c = aiStack_420[0xd9];
    auVar8._0_8_ = CONCAT44(aiStack_420[0xdc],aiStack_420[0xcc]);
    auVar8._8_4_ = aiStack_420[0xcd];
    auVar8._12_4_ = aiStack_420[0xdd];
    auVar16._0_8_ = CONCAT44(aiStack_420[0xfc],aiStack_420[0xec]);
    auVar16._8_4_ = aiStack_420[0xed];
    auVar16._12_4_ = aiStack_420[0xfd];
    uStack_4b0 = aiStack_420[0xcb];
    uStack_4ac = aiStack_420[0xdb];
    local_4a8 = aiStack_420[0xeb];
    uStack_4a4 = aiStack_420[0xfb];
    auVar12._8_8_ = auVar16._0_8_;
    auVar12._0_8_ = auVar8._0_8_;
    local_438._8_8_ = auVar16._8_8_;
    local_438._0_8_ = auVar8._8_8_;
    auVar7 = pmovsxwd(local_438,0x2d422d422d422d42);
    auVar11 = pmovsxwd(auVar12,0x800080008000800);
    do {
      auVar15 = pmulld(*(undefined1 (*) [16])((long)&local_828 + lVar4),auVar7);
      *(int *)((long)&local_428 + lVar4) = auVar15._0_4_ + auVar11._0_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + -4) = auVar15._4_4_ + auVar11._4_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4) = auVar15._8_4_ + auVar11._8_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + 4) = auVar15._12_4_ + auVar11._12_4_ >> 0xc;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x400);
    break;
  case 0xb:
    lVar4 = 0;
    load_buffer_16x16(input,(__m128i *)&local_828,stride,0,0,(int)*av1_fwd_txfm_shift_ls[2]);
    auVar7 = pmovsxwd(extraout_XMM0,0x2d422d422d422d42);
    auVar11 = pmovsxwd(in_XMM1,0x800080008000800);
    do {
      auVar15 = pmulld(*(undefined1 (*) [16])((long)&local_828 + lVar4),auVar7);
      *(int *)((long)&local_428 + lVar4) = auVar15._0_4_ + auVar11._0_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + -4) = auVar15._4_4_ + auVar11._4_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4) = auVar15._8_4_ + auVar11._8_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + 4) = auVar15._12_4_ + auVar11._12_4_ >> 0xc;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x400);
    col_txfm_16x16_rounding((__m128i *)&local_428,-(int)piVar2[1]);
    local_828._0_4_ = (undefined4)local_428;
    local_828._4_4_ = aiStack_420[0xe];
    uStack_820 = aiStack_420[0x1e];
    uStack_81c = aiStack_420[0x2e];
    uStack_7a0 = aiStack_420[0x20];
    uStack_79c = aiStack_420[0x30];
    uStack_760 = aiStack_420[1];
    uStack_75c = aiStack_420[0x11];
    local_758 = aiStack_420[0x21];
    uStack_754 = aiStack_420[0x31];
    uStack_6e0 = aiStack_420[3];
    uStack_6dc = aiStack_420[0x13];
    local_6d8 = aiStack_420[0x23];
    uStack_6d4 = aiStack_420[0x33];
    uStack_6a0 = aiStack_420[0x24];
    uStack_69c = aiStack_420[0x34];
    uStack_660 = aiStack_420[5];
    uStack_65c = aiStack_420[0x15];
    local_658 = aiStack_420[0x25];
    uStack_654 = aiStack_420[0x35];
    uStack_7d0 = aiStack_420[0x3f];
    uStack_7cc = aiStack_420[0x4f];
    local_7c8 = aiStack_420[0x5f];
    uStack_7c4 = aiStack_420[0x6f];
    local_798 = aiStack_420[0x40];
    uStack_794 = aiStack_420[0x50];
    uStack_790 = aiStack_420[0x60];
    uStack_78c = aiStack_420[0x70];
    uStack_750 = aiStack_420[0x41];
    uStack_74c = aiStack_420[0x51];
    local_748 = aiStack_420[0x61];
    uStack_744 = aiStack_420[0x71];
    uStack_6d0 = aiStack_420[0x43];
    uStack_6cc = aiStack_420[0x53];
    local_6c8 = aiStack_420[99];
    uStack_6c4 = aiStack_420[0x73];
    local_698 = aiStack_420[0x44];
    uStack_694 = aiStack_420[0x54];
    uStack_690 = aiStack_420[100];
    uStack_68c = aiStack_420[0x74];
    uStack_650 = aiStack_420[0x45];
    uStack_64c = aiStack_420[0x55];
    local_648 = aiStack_420[0x65];
    uStack_644 = aiStack_420[0x75];
    uStack_5e0 = aiStack_420[7];
    uStack_5dc = aiStack_420[0x17];
    local_5d8 = aiStack_420[0x27];
    uStack_5d4 = aiStack_420[0x37];
    uStack_5a0 = aiStack_420[0x28];
    uStack_59c = aiStack_420[0x38];
    uStack_560 = aiStack_420[9];
    uStack_55c = aiStack_420[0x19];
    local_558 = aiStack_420[0x29];
    uStack_554 = aiStack_420[0x39];
    uStack_4e0 = aiStack_420[0xb];
    uStack_4dc = aiStack_420[0x1b];
    local_4d8 = aiStack_420[0x2b];
    uStack_4d4 = aiStack_420[0x3b];
    uStack_4a0 = aiStack_420[0x2c];
    uStack_49c = aiStack_420[0x3c];
    uStack_460 = aiStack_420[0xd];
    uStack_45c = aiStack_420[0x1d];
    local_458 = aiStack_420[0x2d];
    uStack_454 = aiStack_420[0x3d];
    uStack_5d0 = aiStack_420[0x47];
    uStack_5cc = aiStack_420[0x57];
    local_5c8 = aiStack_420[0x67];
    uStack_5c4 = aiStack_420[0x77];
    local_598 = aiStack_420[0x48];
    uStack_594 = aiStack_420[0x58];
    uStack_590 = aiStack_420[0x68];
    uStack_58c = aiStack_420[0x78];
    uStack_550 = aiStack_420[0x49];
    uStack_54c = aiStack_420[0x59];
    local_548 = aiStack_420[0x69];
    uStack_544 = aiStack_420[0x79];
    uStack_4d0 = aiStack_420[0x4b];
    uStack_4cc = aiStack_420[0x5b];
    local_4c8 = aiStack_420[0x6b];
    uStack_4c4 = aiStack_420[0x7b];
    local_498 = aiStack_420[0x4c];
    uStack_494 = aiStack_420[0x5c];
    uStack_490 = aiStack_420[0x6c];
    uStack_48c = aiStack_420[0x7c];
    uStack_450 = aiStack_420[0x4d];
    uStack_44c = aiStack_420[0x5d];
    local_448 = aiStack_420[0x6d];
    uStack_444 = aiStack_420[0x7d];
    uStack_7c0 = aiStack_420[0x7f];
    uStack_7bc = aiStack_420[0x8f];
    local_7b8 = aiStack_420[0x9f];
    uStack_7b4 = aiStack_420[0xaf];
    local_788 = aiStack_420[0x80];
    uStack_784 = aiStack_420[0x90];
    uStack_780 = aiStack_420[0xa0];
    uStack_77c = aiStack_420[0xb0];
    uStack_740 = aiStack_420[0x81];
    uStack_73c = aiStack_420[0x91];
    local_738 = aiStack_420[0xa1];
    uStack_734 = aiStack_420[0xb1];
    uStack_6c0 = aiStack_420[0x83];
    uStack_6bc = aiStack_420[0x93];
    local_6b8 = aiStack_420[0xa3];
    uStack_6b4 = aiStack_420[0xb3];
    local_688 = aiStack_420[0x84];
    uStack_684 = aiStack_420[0x94];
    uStack_680 = aiStack_420[0xa4];
    uStack_67c = aiStack_420[0xb4];
    uStack_640 = aiStack_420[0x85];
    uStack_63c = aiStack_420[0x95];
    local_638 = aiStack_420[0xa5];
    uStack_634 = aiStack_420[0xb5];
    uStack_7b0 = aiStack_420[0xbf];
    uStack_7ac = aiStack_420[0xcf];
    local_7a8 = aiStack_420[0xdf];
    uStack_7a4 = aiStack_420[0xef];
    local_778 = aiStack_420[0xc0];
    uStack_774 = aiStack_420[0xd0];
    uStack_770 = aiStack_420[0xe0];
    uStack_76c = aiStack_420[0xf0];
    uStack_730 = aiStack_420[0xc1];
    uStack_72c = aiStack_420[0xd1];
    uStack_6b0 = aiStack_420[0xc3];
    uStack_6ac = aiStack_420[0xd3];
    local_6a8 = aiStack_420[0xe3];
    uStack_6a4 = aiStack_420[0xf3];
    local_678 = aiStack_420[0xc4];
    uStack_674 = aiStack_420[0xd4];
    uStack_670 = aiStack_420[0xe4];
    uStack_66c = aiStack_420[0xf4];
    uStack_630 = aiStack_420[0xc5];
    uStack_62c = aiStack_420[0xd5];
    uStack_5c0 = aiStack_420[0x87];
    uStack_5bc = aiStack_420[0x97];
    local_5b8 = aiStack_420[0xa7];
    uStack_5b4 = aiStack_420[0xb7];
    local_588 = aiStack_420[0x88];
    uStack_584 = aiStack_420[0x98];
    uStack_580 = aiStack_420[0xa8];
    uStack_57c = aiStack_420[0xb8];
    uStack_540 = aiStack_420[0x89];
    uStack_53c = aiStack_420[0x99];
    local_538 = aiStack_420[0xa9];
    uStack_534 = aiStack_420[0xb9];
    uStack_4c0 = aiStack_420[0x8b];
    uStack_4bc = aiStack_420[0x9b];
    local_4b8 = aiStack_420[0xab];
    uStack_4b4 = aiStack_420[0xbb];
    local_488 = aiStack_420[0x8c];
    uStack_484 = aiStack_420[0x9c];
    uStack_480 = aiStack_420[0xac];
    uStack_47c = aiStack_420[0xbc];
    uStack_440 = aiStack_420[0x8d];
    uStack_43c = aiStack_420[0x9d];
    local_438._4_4_ = aiStack_420[0xbd];
    local_438._0_4_ = aiStack_420[0xad];
    uStack_5b0 = aiStack_420[199];
    uStack_5ac = aiStack_420[0xd7];
    local_5a8 = aiStack_420[0xe7];
    uStack_5a4 = aiStack_420[0xf7];
    local_578 = aiStack_420[200];
    uStack_574 = aiStack_420[0xd8];
    uStack_570 = aiStack_420[0xe8];
    uStack_56c = aiStack_420[0xf8];
    uStack_530 = aiStack_420[0xc9];
    uStack_52c = aiStack_420[0xd9];
    uStack_4b0 = aiStack_420[0xcb];
    uStack_4ac = aiStack_420[0xdb];
    local_4a8 = aiStack_420[0xeb];
    uStack_4a4 = aiStack_420[0xfb];
    local_438._8_4_ = aiStack_420[0xcd];
    local_438._12_4_ = aiStack_420[0xdd];
    local_428._0_4_ = aiStack_420[0xed];
    local_428._4_4_ = aiStack_420[0xfd];
    goto LAB_004196c9;
  case 0xc:
    lVar4 = 0;
    load_buffer_16x16(input,(__m128i *)&local_828,stride,0,0,(int)*av1_fwd_txfm_shift_ls[2]);
    fadst16x16_sse4_1((__m128i *)&local_828,(__m128i *)&local_428,0xd,4);
    col_txfm_16x16_rounding((__m128i *)&local_428,-(int)piVar2[1]);
    local_828._0_4_ = (undefined4)local_428;
    local_828._4_4_ = aiStack_420[0xe];
    uStack_820 = aiStack_420[0x1e];
    uStack_81c = aiStack_420[0x2e];
    uStack_7a0 = aiStack_420[0x20];
    uStack_79c = aiStack_420[0x30];
    uStack_760 = aiStack_420[1];
    uStack_75c = aiStack_420[0x11];
    local_758 = aiStack_420[0x21];
    uStack_754 = aiStack_420[0x31];
    uStack_6e0 = aiStack_420[3];
    uStack_6dc = aiStack_420[0x13];
    local_6d8 = aiStack_420[0x23];
    uStack_6d4 = aiStack_420[0x33];
    uStack_6a0 = aiStack_420[0x24];
    uStack_69c = aiStack_420[0x34];
    uStack_660 = aiStack_420[5];
    uStack_65c = aiStack_420[0x15];
    local_658 = aiStack_420[0x25];
    uStack_654 = aiStack_420[0x35];
    uStack_7d0 = aiStack_420[0x3f];
    uStack_7cc = aiStack_420[0x4f];
    local_7c8 = aiStack_420[0x5f];
    uStack_7c4 = aiStack_420[0x6f];
    local_798 = aiStack_420[0x40];
    uStack_794 = aiStack_420[0x50];
    uStack_790 = aiStack_420[0x60];
    uStack_78c = aiStack_420[0x70];
    uStack_750 = aiStack_420[0x41];
    uStack_74c = aiStack_420[0x51];
    local_748 = aiStack_420[0x61];
    uStack_744 = aiStack_420[0x71];
    uStack_6d0 = aiStack_420[0x43];
    uStack_6cc = aiStack_420[0x53];
    local_6c8 = aiStack_420[99];
    uStack_6c4 = aiStack_420[0x73];
    local_698 = aiStack_420[0x44];
    uStack_694 = aiStack_420[0x54];
    uStack_690 = aiStack_420[100];
    uStack_68c = aiStack_420[0x74];
    uStack_650 = aiStack_420[0x45];
    uStack_64c = aiStack_420[0x55];
    local_648 = aiStack_420[0x65];
    uStack_644 = aiStack_420[0x75];
    uStack_5e0 = aiStack_420[7];
    uStack_5dc = aiStack_420[0x17];
    local_5d8 = aiStack_420[0x27];
    uStack_5d4 = aiStack_420[0x37];
    uStack_5a0 = aiStack_420[0x28];
    uStack_59c = aiStack_420[0x38];
    uStack_560 = aiStack_420[9];
    uStack_55c = aiStack_420[0x19];
    local_558 = aiStack_420[0x29];
    uStack_554 = aiStack_420[0x39];
    uStack_4e0 = aiStack_420[0xb];
    uStack_4dc = aiStack_420[0x1b];
    local_4d8 = aiStack_420[0x2b];
    uStack_4d4 = aiStack_420[0x3b];
    uStack_4a0 = aiStack_420[0x2c];
    uStack_49c = aiStack_420[0x3c];
    uStack_460 = aiStack_420[0xd];
    uStack_45c = aiStack_420[0x1d];
    local_458 = aiStack_420[0x2d];
    uStack_454 = aiStack_420[0x3d];
    uStack_5d0 = aiStack_420[0x47];
    uStack_5cc = aiStack_420[0x57];
    local_5c8 = aiStack_420[0x67];
    uStack_5c4 = aiStack_420[0x77];
    local_598 = aiStack_420[0x48];
    uStack_594 = aiStack_420[0x58];
    uStack_590 = aiStack_420[0x68];
    uStack_58c = aiStack_420[0x78];
    uStack_550 = aiStack_420[0x49];
    uStack_54c = aiStack_420[0x59];
    local_548 = aiStack_420[0x69];
    uStack_544 = aiStack_420[0x79];
    uStack_4d0 = aiStack_420[0x4b];
    uStack_4cc = aiStack_420[0x5b];
    local_4c8 = aiStack_420[0x6b];
    uStack_4c4 = aiStack_420[0x7b];
    local_498 = aiStack_420[0x4c];
    uStack_494 = aiStack_420[0x5c];
    uStack_490 = aiStack_420[0x6c];
    uStack_48c = aiStack_420[0x7c];
    uStack_450 = aiStack_420[0x4d];
    uStack_44c = aiStack_420[0x5d];
    local_448 = aiStack_420[0x6d];
    uStack_444 = aiStack_420[0x7d];
    uStack_7c0 = aiStack_420[0x7f];
    uStack_7bc = aiStack_420[0x8f];
    local_7b8 = aiStack_420[0x9f];
    uStack_7b4 = aiStack_420[0xaf];
    local_788 = aiStack_420[0x80];
    uStack_784 = aiStack_420[0x90];
    uStack_780 = aiStack_420[0xa0];
    uStack_77c = aiStack_420[0xb0];
    uStack_740 = aiStack_420[0x81];
    uStack_73c = aiStack_420[0x91];
    local_738 = aiStack_420[0xa1];
    uStack_734 = aiStack_420[0xb1];
    uStack_6c0 = aiStack_420[0x83];
    uStack_6bc = aiStack_420[0x93];
    local_6b8 = aiStack_420[0xa3];
    uStack_6b4 = aiStack_420[0xb3];
    local_688 = aiStack_420[0x84];
    uStack_684 = aiStack_420[0x94];
    uStack_680 = aiStack_420[0xa4];
    uStack_67c = aiStack_420[0xb4];
    uStack_640 = aiStack_420[0x85];
    uStack_63c = aiStack_420[0x95];
    local_638 = aiStack_420[0xa5];
    uStack_634 = aiStack_420[0xb5];
    uStack_7b0 = aiStack_420[0xbf];
    uStack_7ac = aiStack_420[0xcf];
    local_7a8 = aiStack_420[0xdf];
    uStack_7a4 = aiStack_420[0xef];
    local_778 = aiStack_420[0xc0];
    uStack_774 = aiStack_420[0xd0];
    uStack_770 = aiStack_420[0xe0];
    uStack_76c = aiStack_420[0xf0];
    uStack_730 = aiStack_420[0xc1];
    uStack_72c = aiStack_420[0xd1];
    uStack_6b0 = aiStack_420[0xc3];
    uStack_6ac = aiStack_420[0xd3];
    local_6a8 = aiStack_420[0xe3];
    uStack_6a4 = aiStack_420[0xf3];
    local_678 = aiStack_420[0xc4];
    uStack_674 = aiStack_420[0xd4];
    uStack_670 = aiStack_420[0xe4];
    uStack_66c = aiStack_420[0xf4];
    uStack_630 = aiStack_420[0xc5];
    uStack_62c = aiStack_420[0xd5];
    uStack_5c0 = aiStack_420[0x87];
    uStack_5bc = aiStack_420[0x97];
    local_5b8 = aiStack_420[0xa7];
    uStack_5b4 = aiStack_420[0xb7];
    local_588 = aiStack_420[0x88];
    uStack_584 = aiStack_420[0x98];
    uStack_580 = aiStack_420[0xa8];
    uStack_57c = aiStack_420[0xb8];
    uStack_540 = aiStack_420[0x89];
    uStack_53c = aiStack_420[0x99];
    local_538 = aiStack_420[0xa9];
    uStack_534 = aiStack_420[0xb9];
    uStack_4c0 = aiStack_420[0x8b];
    uStack_4bc = aiStack_420[0x9b];
    local_4b8 = aiStack_420[0xab];
    uStack_4b4 = aiStack_420[0xbb];
    local_488 = aiStack_420[0x8c];
    uStack_484 = aiStack_420[0x9c];
    uStack_480 = aiStack_420[0xac];
    uStack_47c = aiStack_420[0xbc];
    uStack_440 = aiStack_420[0x8d];
    uStack_43c = aiStack_420[0x9d];
    uStack_5b0 = aiStack_420[199];
    uStack_5ac = aiStack_420[0xd7];
    local_5a8 = aiStack_420[0xe7];
    uStack_5a4 = aiStack_420[0xf7];
    local_578 = aiStack_420[200];
    uStack_574 = aiStack_420[0xd8];
    uStack_570 = aiStack_420[0xe8];
    uStack_56c = aiStack_420[0xf8];
    uStack_530 = aiStack_420[0xc9];
    uStack_52c = aiStack_420[0xd9];
    auVar5._0_8_ = CONCAT44(aiStack_420[0xdc],aiStack_420[0xcc]);
    auVar5._8_4_ = aiStack_420[0xcd];
    auVar5._12_4_ = aiStack_420[0xdd];
    auVar13._0_8_ = CONCAT44(aiStack_420[0xfc],aiStack_420[0xec]);
    auVar13._8_4_ = aiStack_420[0xed];
    auVar13._12_4_ = aiStack_420[0xfd];
    uStack_4b0 = aiStack_420[0xcb];
    uStack_4ac = aiStack_420[0xdb];
    local_4a8 = aiStack_420[0xeb];
    uStack_4a4 = aiStack_420[0xfb];
    auVar9._8_8_ = auVar13._0_8_;
    auVar9._0_8_ = auVar5._0_8_;
    local_438._8_8_ = auVar13._8_8_;
    local_438._0_8_ = auVar5._8_8_;
    auVar7 = pmovsxwd(local_438,0x2d422d422d422d42);
    auVar11 = pmovsxwd(auVar9,0x800080008000800);
    do {
      auVar15 = pmulld(*(undefined1 (*) [16])((long)&local_828 + lVar4),auVar7);
      *(int *)((long)&local_428 + lVar4) = auVar15._0_4_ + auVar11._0_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + -4) = auVar15._4_4_ + auVar11._4_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4) = auVar15._8_4_ + auVar11._8_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + 4) = auVar15._12_4_ + auVar11._12_4_ >> 0xc;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x400);
    break;
  case 0xd:
    lVar4 = 0;
    load_buffer_16x16(input,(__m128i *)&local_828,stride,0,0,(int)*av1_fwd_txfm_shift_ls[2]);
    auVar7 = pmovsxwd(extraout_XMM0_01,0x2d422d422d422d42);
    auVar11 = pmovsxwd(in_XMM1,0x800080008000800);
    do {
      auVar15 = pmulld(*(undefined1 (*) [16])((long)&local_828 + lVar4),auVar7);
      *(int *)((long)&local_428 + lVar4) = auVar15._0_4_ + auVar11._0_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + -4) = auVar15._4_4_ + auVar11._4_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4) = auVar15._8_4_ + auVar11._8_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + 4) = auVar15._12_4_ + auVar11._12_4_ >> 0xc;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x400);
    goto LAB_0041976a;
  case 0xe:
    lVar4 = 0;
    load_buffer_16x16(input,(__m128i *)&local_828,stride,1,0,(int)*av1_fwd_txfm_shift_ls[2]);
    fadst16x16_sse4_1((__m128i *)&local_828,(__m128i *)&local_428,0xd,4);
    col_txfm_16x16_rounding((__m128i *)&local_428,-(int)piVar2[1]);
    local_828._0_4_ = (undefined4)local_428;
    local_828._4_4_ = aiStack_420[0xe];
    uStack_820 = aiStack_420[0x1e];
    uStack_81c = aiStack_420[0x2e];
    uStack_7a0 = aiStack_420[0x20];
    uStack_79c = aiStack_420[0x30];
    uStack_760 = aiStack_420[1];
    uStack_75c = aiStack_420[0x11];
    local_758 = aiStack_420[0x21];
    uStack_754 = aiStack_420[0x31];
    uStack_6e0 = aiStack_420[3];
    uStack_6dc = aiStack_420[0x13];
    local_6d8 = aiStack_420[0x23];
    uStack_6d4 = aiStack_420[0x33];
    uStack_6a0 = aiStack_420[0x24];
    uStack_69c = aiStack_420[0x34];
    uStack_660 = aiStack_420[5];
    uStack_65c = aiStack_420[0x15];
    local_658 = aiStack_420[0x25];
    uStack_654 = aiStack_420[0x35];
    uStack_7d0 = aiStack_420[0x3f];
    uStack_7cc = aiStack_420[0x4f];
    local_7c8 = aiStack_420[0x5f];
    uStack_7c4 = aiStack_420[0x6f];
    local_798 = aiStack_420[0x40];
    uStack_794 = aiStack_420[0x50];
    uStack_790 = aiStack_420[0x60];
    uStack_78c = aiStack_420[0x70];
    uStack_750 = aiStack_420[0x41];
    uStack_74c = aiStack_420[0x51];
    local_748 = aiStack_420[0x61];
    uStack_744 = aiStack_420[0x71];
    uStack_6d0 = aiStack_420[0x43];
    uStack_6cc = aiStack_420[0x53];
    local_6c8 = aiStack_420[99];
    uStack_6c4 = aiStack_420[0x73];
    local_698 = aiStack_420[0x44];
    uStack_694 = aiStack_420[0x54];
    uStack_690 = aiStack_420[100];
    uStack_68c = aiStack_420[0x74];
    uStack_650 = aiStack_420[0x45];
    uStack_64c = aiStack_420[0x55];
    local_648 = aiStack_420[0x65];
    uStack_644 = aiStack_420[0x75];
    uStack_5e0 = aiStack_420[7];
    uStack_5dc = aiStack_420[0x17];
    local_5d8 = aiStack_420[0x27];
    uStack_5d4 = aiStack_420[0x37];
    uStack_5a0 = aiStack_420[0x28];
    uStack_59c = aiStack_420[0x38];
    uStack_560 = aiStack_420[9];
    uStack_55c = aiStack_420[0x19];
    local_558 = aiStack_420[0x29];
    uStack_554 = aiStack_420[0x39];
    uStack_4e0 = aiStack_420[0xb];
    uStack_4dc = aiStack_420[0x1b];
    local_4d8 = aiStack_420[0x2b];
    uStack_4d4 = aiStack_420[0x3b];
    uStack_4a0 = aiStack_420[0x2c];
    uStack_49c = aiStack_420[0x3c];
    uStack_460 = aiStack_420[0xd];
    uStack_45c = aiStack_420[0x1d];
    local_458 = aiStack_420[0x2d];
    uStack_454 = aiStack_420[0x3d];
    uStack_5d0 = aiStack_420[0x47];
    uStack_5cc = aiStack_420[0x57];
    local_5c8 = aiStack_420[0x67];
    uStack_5c4 = aiStack_420[0x77];
    local_598 = aiStack_420[0x48];
    uStack_594 = aiStack_420[0x58];
    uStack_590 = aiStack_420[0x68];
    uStack_58c = aiStack_420[0x78];
    uStack_550 = aiStack_420[0x49];
    uStack_54c = aiStack_420[0x59];
    local_548 = aiStack_420[0x69];
    uStack_544 = aiStack_420[0x79];
    uStack_4d0 = aiStack_420[0x4b];
    uStack_4cc = aiStack_420[0x5b];
    local_4c8 = aiStack_420[0x6b];
    uStack_4c4 = aiStack_420[0x7b];
    local_498 = aiStack_420[0x4c];
    uStack_494 = aiStack_420[0x5c];
    uStack_490 = aiStack_420[0x6c];
    uStack_48c = aiStack_420[0x7c];
    uStack_450 = aiStack_420[0x4d];
    uStack_44c = aiStack_420[0x5d];
    local_448 = aiStack_420[0x6d];
    uStack_444 = aiStack_420[0x7d];
    uStack_7c0 = aiStack_420[0x7f];
    uStack_7bc = aiStack_420[0x8f];
    local_7b8 = aiStack_420[0x9f];
    uStack_7b4 = aiStack_420[0xaf];
    local_788 = aiStack_420[0x80];
    uStack_784 = aiStack_420[0x90];
    uStack_780 = aiStack_420[0xa0];
    uStack_77c = aiStack_420[0xb0];
    uStack_740 = aiStack_420[0x81];
    uStack_73c = aiStack_420[0x91];
    local_738 = aiStack_420[0xa1];
    uStack_734 = aiStack_420[0xb1];
    uStack_6c0 = aiStack_420[0x83];
    uStack_6bc = aiStack_420[0x93];
    local_6b8 = aiStack_420[0xa3];
    uStack_6b4 = aiStack_420[0xb3];
    local_688 = aiStack_420[0x84];
    uStack_684 = aiStack_420[0x94];
    uStack_680 = aiStack_420[0xa4];
    uStack_67c = aiStack_420[0xb4];
    uStack_640 = aiStack_420[0x85];
    uStack_63c = aiStack_420[0x95];
    local_638 = aiStack_420[0xa5];
    uStack_634 = aiStack_420[0xb5];
    uStack_7b0 = aiStack_420[0xbf];
    uStack_7ac = aiStack_420[0xcf];
    local_7a8 = aiStack_420[0xdf];
    uStack_7a4 = aiStack_420[0xef];
    local_778 = aiStack_420[0xc0];
    uStack_774 = aiStack_420[0xd0];
    uStack_770 = aiStack_420[0xe0];
    uStack_76c = aiStack_420[0xf0];
    uStack_730 = aiStack_420[0xc1];
    uStack_72c = aiStack_420[0xd1];
    uStack_6b0 = aiStack_420[0xc3];
    uStack_6ac = aiStack_420[0xd3];
    local_6a8 = aiStack_420[0xe3];
    uStack_6a4 = aiStack_420[0xf3];
    local_678 = aiStack_420[0xc4];
    uStack_674 = aiStack_420[0xd4];
    uStack_670 = aiStack_420[0xe4];
    uStack_66c = aiStack_420[0xf4];
    uStack_630 = aiStack_420[0xc5];
    uStack_62c = aiStack_420[0xd5];
    uStack_5c0 = aiStack_420[0x87];
    uStack_5bc = aiStack_420[0x97];
    local_5b8 = aiStack_420[0xa7];
    uStack_5b4 = aiStack_420[0xb7];
    local_588 = aiStack_420[0x88];
    uStack_584 = aiStack_420[0x98];
    uStack_580 = aiStack_420[0xa8];
    uStack_57c = aiStack_420[0xb8];
    uStack_540 = aiStack_420[0x89];
    uStack_53c = aiStack_420[0x99];
    local_538 = aiStack_420[0xa9];
    uStack_534 = aiStack_420[0xb9];
    uStack_4c0 = aiStack_420[0x8b];
    uStack_4bc = aiStack_420[0x9b];
    local_4b8 = aiStack_420[0xab];
    uStack_4b4 = aiStack_420[0xbb];
    local_488 = aiStack_420[0x8c];
    uStack_484 = aiStack_420[0x9c];
    uStack_480 = aiStack_420[0xac];
    uStack_47c = aiStack_420[0xbc];
    uStack_440 = aiStack_420[0x8d];
    uStack_43c = aiStack_420[0x9d];
    uStack_5b0 = aiStack_420[199];
    uStack_5ac = aiStack_420[0xd7];
    local_5a8 = aiStack_420[0xe7];
    uStack_5a4 = aiStack_420[0xf7];
    local_578 = aiStack_420[200];
    uStack_574 = aiStack_420[0xd8];
    uStack_570 = aiStack_420[0xe8];
    uStack_56c = aiStack_420[0xf8];
    uStack_530 = aiStack_420[0xc9];
    uStack_52c = aiStack_420[0xd9];
    auVar7._0_8_ = CONCAT44(aiStack_420[0xdc],aiStack_420[0xcc]);
    auVar7._8_4_ = aiStack_420[0xcd];
    auVar7._12_4_ = aiStack_420[0xdd];
    auVar15._0_8_ = CONCAT44(aiStack_420[0xfc],aiStack_420[0xec]);
    auVar15._8_4_ = aiStack_420[0xed];
    auVar15._12_4_ = aiStack_420[0xfd];
    uStack_4b0 = aiStack_420[0xcb];
    uStack_4ac = aiStack_420[0xdb];
    local_4a8 = aiStack_420[0xeb];
    uStack_4a4 = aiStack_420[0xfb];
    auVar11._8_8_ = auVar15._0_8_;
    auVar11._0_8_ = auVar7._0_8_;
    local_438._8_8_ = auVar15._8_8_;
    local_438._0_8_ = auVar7._8_8_;
    auVar7 = pmovsxwd(local_438,0x2d422d422d422d42);
    auVar11 = pmovsxwd(auVar11,0x800080008000800);
    do {
      auVar15 = pmulld(*(undefined1 (*) [16])((long)&local_828 + lVar4),auVar7);
      *(int *)((long)&local_428 + lVar4) = auVar15._0_4_ + auVar11._0_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + -4) = auVar15._4_4_ + auVar11._4_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4) = auVar15._8_4_ + auVar11._8_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + 4) = auVar15._12_4_ + auVar11._12_4_ >> 0xc;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x400);
    break;
  case 0xf:
    lVar4 = 0;
    load_buffer_16x16(input,(__m128i *)&local_828,stride,0,1,(int)*av1_fwd_txfm_shift_ls[2]);
    auVar7 = pmovsxwd(extraout_XMM0_00,0x2d422d422d422d42);
    auVar11 = pmovsxwd(in_XMM1,0x800080008000800);
    do {
      auVar15 = pmulld(*(undefined1 (*) [16])((long)&local_828 + lVar4),auVar7);
      *(int *)((long)&local_428 + lVar4) = auVar15._0_4_ + auVar11._0_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + -4) = auVar15._4_4_ + auVar11._4_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4) = auVar15._8_4_ + auVar11._8_4_ >> 0xc;
      *(int *)((long)aiStack_420 + lVar4 + 4) = auVar15._12_4_ + auVar11._12_4_ >> 0xc;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x400);
LAB_0041976a:
    col_txfm_16x16_rounding((__m128i *)&local_428,-(int)piVar2[1]);
    local_828._0_4_ = (undefined4)local_428;
    local_828._4_4_ = aiStack_420[0xe];
    uStack_820 = aiStack_420[0x1e];
    uStack_81c = aiStack_420[0x2e];
    uStack_7a0 = aiStack_420[0x20];
    uStack_79c = aiStack_420[0x30];
    uStack_760 = aiStack_420[1];
    uStack_75c = aiStack_420[0x11];
    local_758 = aiStack_420[0x21];
    uStack_754 = aiStack_420[0x31];
    uStack_6e0 = aiStack_420[3];
    uStack_6dc = aiStack_420[0x13];
    local_6d8 = aiStack_420[0x23];
    uStack_6d4 = aiStack_420[0x33];
    uStack_6a0 = aiStack_420[0x24];
    uStack_69c = aiStack_420[0x34];
    uStack_660 = aiStack_420[5];
    uStack_65c = aiStack_420[0x15];
    local_658 = aiStack_420[0x25];
    uStack_654 = aiStack_420[0x35];
    uStack_7d0 = aiStack_420[0x3f];
    uStack_7cc = aiStack_420[0x4f];
    local_7c8 = aiStack_420[0x5f];
    uStack_7c4 = aiStack_420[0x6f];
    local_798 = aiStack_420[0x40];
    uStack_794 = aiStack_420[0x50];
    uStack_790 = aiStack_420[0x60];
    uStack_78c = aiStack_420[0x70];
    uStack_750 = aiStack_420[0x41];
    uStack_74c = aiStack_420[0x51];
    local_748 = aiStack_420[0x61];
    uStack_744 = aiStack_420[0x71];
    uStack_6d0 = aiStack_420[0x43];
    uStack_6cc = aiStack_420[0x53];
    local_6c8 = aiStack_420[99];
    uStack_6c4 = aiStack_420[0x73];
    local_698 = aiStack_420[0x44];
    uStack_694 = aiStack_420[0x54];
    uStack_690 = aiStack_420[100];
    uStack_68c = aiStack_420[0x74];
    uStack_650 = aiStack_420[0x45];
    uStack_64c = aiStack_420[0x55];
    local_648 = aiStack_420[0x65];
    uStack_644 = aiStack_420[0x75];
    uStack_5e0 = aiStack_420[7];
    uStack_5dc = aiStack_420[0x17];
    local_5d8 = aiStack_420[0x27];
    uStack_5d4 = aiStack_420[0x37];
    uStack_5a0 = aiStack_420[0x28];
    uStack_59c = aiStack_420[0x38];
    uStack_560 = aiStack_420[9];
    uStack_55c = aiStack_420[0x19];
    local_558 = aiStack_420[0x29];
    uStack_554 = aiStack_420[0x39];
    uStack_4e0 = aiStack_420[0xb];
    uStack_4dc = aiStack_420[0x1b];
    local_4d8 = aiStack_420[0x2b];
    uStack_4d4 = aiStack_420[0x3b];
    uStack_4a0 = aiStack_420[0x2c];
    uStack_49c = aiStack_420[0x3c];
    uStack_460 = aiStack_420[0xd];
    uStack_45c = aiStack_420[0x1d];
    local_458 = aiStack_420[0x2d];
    uStack_454 = aiStack_420[0x3d];
    uStack_5d0 = aiStack_420[0x47];
    uStack_5cc = aiStack_420[0x57];
    local_5c8 = aiStack_420[0x67];
    uStack_5c4 = aiStack_420[0x77];
    local_598 = aiStack_420[0x48];
    uStack_594 = aiStack_420[0x58];
    uStack_590 = aiStack_420[0x68];
    uStack_58c = aiStack_420[0x78];
    uStack_550 = aiStack_420[0x49];
    uStack_54c = aiStack_420[0x59];
    local_548 = aiStack_420[0x69];
    uStack_544 = aiStack_420[0x79];
    uStack_4d0 = aiStack_420[0x4b];
    uStack_4cc = aiStack_420[0x5b];
    local_4c8 = aiStack_420[0x6b];
    uStack_4c4 = aiStack_420[0x7b];
    local_498 = aiStack_420[0x4c];
    uStack_494 = aiStack_420[0x5c];
    uStack_490 = aiStack_420[0x6c];
    uStack_48c = aiStack_420[0x7c];
    uStack_450 = aiStack_420[0x4d];
    uStack_44c = aiStack_420[0x5d];
    local_448 = aiStack_420[0x6d];
    uStack_444 = aiStack_420[0x7d];
    uStack_7c0 = aiStack_420[0x7f];
    uStack_7bc = aiStack_420[0x8f];
    local_7b8 = aiStack_420[0x9f];
    uStack_7b4 = aiStack_420[0xaf];
    local_788 = aiStack_420[0x80];
    uStack_784 = aiStack_420[0x90];
    uStack_780 = aiStack_420[0xa0];
    uStack_77c = aiStack_420[0xb0];
    uStack_740 = aiStack_420[0x81];
    uStack_73c = aiStack_420[0x91];
    local_738 = aiStack_420[0xa1];
    uStack_734 = aiStack_420[0xb1];
    uStack_6c0 = aiStack_420[0x83];
    uStack_6bc = aiStack_420[0x93];
    local_6b8 = aiStack_420[0xa3];
    uStack_6b4 = aiStack_420[0xb3];
    local_688 = aiStack_420[0x84];
    uStack_684 = aiStack_420[0x94];
    uStack_680 = aiStack_420[0xa4];
    uStack_67c = aiStack_420[0xb4];
    uStack_640 = aiStack_420[0x85];
    uStack_63c = aiStack_420[0x95];
    local_638 = aiStack_420[0xa5];
    uStack_634 = aiStack_420[0xb5];
    uStack_7b0 = aiStack_420[0xbf];
    uStack_7ac = aiStack_420[0xcf];
    local_7a8 = aiStack_420[0xdf];
    uStack_7a4 = aiStack_420[0xef];
    local_778 = aiStack_420[0xc0];
    uStack_774 = aiStack_420[0xd0];
    uStack_770 = aiStack_420[0xe0];
    uStack_76c = aiStack_420[0xf0];
    uStack_730 = aiStack_420[0xc1];
    uStack_72c = aiStack_420[0xd1];
    uStack_6b0 = aiStack_420[0xc3];
    uStack_6ac = aiStack_420[0xd3];
    local_6a8 = aiStack_420[0xe3];
    uStack_6a4 = aiStack_420[0xf3];
    local_678 = aiStack_420[0xc4];
    uStack_674 = aiStack_420[0xd4];
    uStack_670 = aiStack_420[0xe4];
    uStack_66c = aiStack_420[0xf4];
    uStack_630 = aiStack_420[0xc5];
    uStack_62c = aiStack_420[0xd5];
    uStack_5c0 = aiStack_420[0x87];
    uStack_5bc = aiStack_420[0x97];
    local_5b8 = aiStack_420[0xa7];
    uStack_5b4 = aiStack_420[0xb7];
    local_588 = aiStack_420[0x88];
    uStack_584 = aiStack_420[0x98];
    uStack_580 = aiStack_420[0xa8];
    uStack_57c = aiStack_420[0xb8];
    uStack_540 = aiStack_420[0x89];
    uStack_53c = aiStack_420[0x99];
    local_538 = aiStack_420[0xa9];
    uStack_534 = aiStack_420[0xb9];
    uStack_4c0 = aiStack_420[0x8b];
    uStack_4bc = aiStack_420[0x9b];
    local_4b8 = aiStack_420[0xab];
    uStack_4b4 = aiStack_420[0xbb];
    local_488 = aiStack_420[0x8c];
    uStack_484 = aiStack_420[0x9c];
    uStack_480 = aiStack_420[0xac];
    uStack_47c = aiStack_420[0xbc];
    uStack_440 = aiStack_420[0x8d];
    uStack_43c = aiStack_420[0x9d];
    local_438._4_4_ = aiStack_420[0xbd];
    local_438._0_4_ = aiStack_420[0xad];
    uStack_5b0 = aiStack_420[199];
    uStack_5ac = aiStack_420[0xd7];
    local_5a8 = aiStack_420[0xe7];
    uStack_5a4 = aiStack_420[0xf7];
    local_578 = aiStack_420[200];
    uStack_574 = aiStack_420[0xd8];
    uStack_570 = aiStack_420[0xe8];
    uStack_56c = aiStack_420[0xf8];
    uStack_530 = aiStack_420[0xc9];
    uStack_52c = aiStack_420[0xd9];
    uStack_4b0 = aiStack_420[0xcb];
    uStack_4ac = aiStack_420[0xdb];
    local_4a8 = aiStack_420[0xeb];
    uStack_4a4 = aiStack_420[0xfb];
    local_438._8_4_ = aiStack_420[0xcd];
    local_438._12_4_ = aiStack_420[0xdd];
    local_428._0_4_ = aiStack_420[0xed];
    local_428._4_4_ = aiStack_420[0xfd];
    goto LAB_0041ab19;
  }
  write_buffer_16x16((__m128i *)&local_428,coeff);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x16_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[64], out[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X16];
  const int txw_idx = get_txw_idx(TX_16X16);
  const int txh_idx = get_txh_idx(TX_16X16);
  const int col_num = 4;
  switch (tx_type) {
    case DCT_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case ADST_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case DCT_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case ADST_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case FLIPADST_DCT:
      load_buffer_16x16(input, in, stride, 1, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case DCT_FLIPADST:
      load_buffer_16x16(input, in, stride, 0, 1, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_16x16(input, in, stride, 1, 1, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case ADST_FLIPADST:
      load_buffer_16x16(input, in, stride, 0, 1, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case FLIPADST_ADST:
      load_buffer_16x16(input, in, stride, 1, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case IDTX:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case V_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case H_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case V_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case H_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case V_FLIPADST:
      load_buffer_16x16(input, in, stride, 1, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case H_FLIPADST:
      load_buffer_16x16(input, in, stride, 0, 1, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    default: assert(0);
  }
  (void)bd;
}